

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O1

NLW2_SOLReadResultCode mp::Read<double>(FILE *f,int binary,pair<int,_double> *v,string *err)

{
  char *pcVar1;
  char *in_RAX;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  char *se;
  char *local_28;
  
  local_28 = in_RAX;
  std::__cxx11::string::resize((ulong)err,'\0');
  if (binary == 0) {
    pcVar3 = fgets((err->_M_dataplus)._M_p,(int)err->_M_string_length + -1,(FILE *)f);
    if (pcVar3 == (char *)0x0) {
      return NLW2_SOLRead_Early_EOF;
    }
    pcVar3 = (err->_M_dataplus)._M_p;
    lVar4 = strtol(pcVar3,&local_28,10);
    pcVar1 = local_28;
    v->first = (int)lVar4;
    if ((local_28 <= pcVar3) || (dVar5 = strtod(local_28,&local_28), local_28 <= pcVar1)) {
      return NLW2_SOLRead_Bad_Line;
    }
    v->second = dVar5;
  }
  else {
    sVar2 = fread(v,4,1,(FILE *)f);
    if (sVar2 != 1) {
      return NLW2_SOLRead_Early_EOF;
    }
    sVar2 = fread(&v->second,8,1,(FILE *)f);
    if (sVar2 != 1) {
      return NLW2_SOLRead_Early_EOF;
    }
  }
  return NLW2_SOLRead_OK;
}

Assistant:

inline NLW2_SOLReadResultCode Read(
    FILE* f, int binary,
    std::pair<int, El>& v, std::string& err) {
  err.resize(512);
  if (binary) {
    if (fread(&v.first, sizeof(int), 1, f) != 1
        || fread(&v.second, sizeof(El), 1, f) != 1)
      return NLW2_SOLRead_Early_EOF;
  } else {
    if (!fgets((char*)err.data(), err.size()-1, f))
      return NLW2_SOLRead_Early_EOF;
    const char *s;
    char *se;
    v.first = (int)strtol(s = err.c_str(), &se, 10);
    if (se <= s)
      return NLW2_SOLRead_Bad_Line;
    auto el = strtod(s = se, &se);
    if (se <= s)
      return NLW2_SOLRead_Bad_Line;
    v.second = (El)el;
  }
  return NLW2_SOLRead_OK;
}